

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

Validity * __thiscall
capnp::compiler::CompilerMain::setSegmentSize
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr size)

{
  long lVar1;
  size_t size_00;
  char *value;
  char *end;
  char *local_40;
  String local_38;
  
  if (this->flat == true) {
    value = "cannot be used with --flat";
    size_00 = 0x1a;
  }
  else {
    lVar1 = strtol(size.content.ptr,&local_40,0);
    this->segmentSize = (uint)lVar1;
    if ((size.content.size_ != 1) && (*local_40 == '\0')) {
      (__return_storage_ptr__->errorMessage).ptr.isSet = false;
      return __return_storage_ptr__;
    }
    value = "not an integer";
    size_00 = 0xe;
  }
  kj::heapString(&local_38,value,size_00);
  (__return_storage_ptr__->errorMessage).ptr.isSet = true;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr = local_38.content.ptr;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ = local_38.content.size_;
  (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
       local_38.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setSegmentSize(kj::StringPtr size) {
    if (flat) return "cannot be used with --flat";
    char* end;
    segmentSize = strtol(size.cStr(), &end, 0);
    if (size.size() == 0 || *end != '\0') {
      return "not an integer";
    }
    return true;
  }